

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::CreateRenderbufferFramebuffer
          (GetAttachmentParametersTest *this,bool depth,bool stencil)

{
  int iVar1;
  deUint32 dVar2;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  undefined4 *puVar5;
  MessageBuilder local_1a0;
  long local_20;
  Functions *gl;
  bool stencil_local;
  GetAttachmentParametersTest *pGStack_10;
  bool depth_local;
  GetAttachmentParametersTest *this_local;
  
  gl._6_1_ = stencil;
  gl._7_1_ = depth;
  pGStack_10 = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  local_20 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_20 + 0x6d0))(1,&this->m_fbo);
  dVar2 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar2,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xfdf);
  (**(code **)(local_20 + 0x78))(0x8d40,this->m_fbo);
  dVar2 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xfe2);
  (**(code **)(local_20 + 0x6e8))(3,this->m_rbo);
  dVar2 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar2,"glGenRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xfe5);
  (**(code **)(local_20 + 0xa0))(0x8d41,this->m_rbo[0]);
  dVar2 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar2,"glBindRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xfe8);
  (**(code **)(local_20 + 0x1238))(0x8d41,0x8058,1,2);
  dVar2 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar2,"glRenderbufferStorage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xfeb);
  (**(code **)(local_20 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_rbo[0]);
  dVar2 = (**(code **)(local_20 + 0x800))();
  glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xfee);
  if (((gl._7_1_ & 1) != 0) && ((gl._6_1_ & 1) == 0)) {
    (**(code **)(local_20 + 0xa0))(0x8d41,this->m_rbo[1]);
    dVar2 = (**(code **)(local_20 + 0x800))();
    glu::checkError(dVar2,"glBindRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xff3);
    (**(code **)(local_20 + 0x1238))(0x8d41,0x81a6,1,2);
    dVar2 = (**(code **)(local_20 + 0x800))();
    glu::checkError(dVar2,"glRenderbufferStorage has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xff6);
    (**(code **)(local_20 + 0x688))(0x8d40,0x8d00,0x8d41,this->m_rbo[1]);
    dVar2 = (**(code **)(local_20 + 0x800))();
    glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xff9);
  }
  if (((gl._7_1_ & 1) == 0) && ((gl._6_1_ & 1) != 0)) {
    (**(code **)(local_20 + 0xa0))(0x8d41,this->m_rbo[1]);
    dVar2 = (**(code **)(local_20 + 0x800))();
    glu::checkError(dVar2,"glBindRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xfff);
    (**(code **)(local_20 + 0x1238))(0x8d41,0x8d48,1,2);
    dVar2 = (**(code **)(local_20 + 0x800))();
    glu::checkError(dVar2,"glRenderbufferStorage has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1002);
    (**(code **)(local_20 + 0x688))(0x8d40,0x8d20,0x8d41,this->m_rbo[1]);
    dVar2 = (**(code **)(local_20 + 0x800))();
    glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1005);
  }
  if (((gl._7_1_ & 1) != 0) && ((gl._6_1_ & 1) != 0)) {
    (**(code **)(local_20 + 0xa0))(0x8d41,this->m_rbo[1]);
    dVar2 = (**(code **)(local_20 + 0x800))();
    glu::checkError(dVar2,"glBindRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x100b);
    (**(code **)(local_20 + 0x1238))(0x8d41,0x88f0,1,2);
    dVar2 = (**(code **)(local_20 + 0x800))();
    glu::checkError(dVar2,"glRenderbufferStorage has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x100e);
    (**(code **)(local_20 + 0x688))(0x8d40,0x821a,0x8d41,this->m_rbo[1]);
    dVar2 = (**(code **)(local_20 + 0x800))();
    glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1011);
  }
  GVar3 = glwCheckFramebufferStatus(0x8d40);
  if (GVar3 != 0x8cd5) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    this_02 = tcu::MessageBuilder::operator<<
                        (&local_1a0,(char (*) [41])"Unexpectedly framebuffer was incomplete.");
    tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&int::typeinfo,0);
  }
  return;
}

Assistant:

void GetAttachmentParametersTest::CreateRenderbufferFramebuffer(bool depth, bool stencil)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(1, &m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

	gl.genRenderbuffers(3, m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

	gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, 1, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");

	if (depth && (!stencil))
	{
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

		gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT24, 1, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_rbo[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
	}

	if ((!depth) && stencil)
	{
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

		gl.renderbufferStorage(GL_RENDERBUFFER, GL_STENCIL_INDEX8, 1, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_rbo[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
	}

	if (depth && stencil)
	{
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

		gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH24_STENCIL8, 1, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_rbo[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
	}

	/* Check that framebuffer is complete. */
	if (GL_FRAMEBUFFER_COMPLETE != glCheckFramebufferStatus(GL_FRAMEBUFFER))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Unexpectedly framebuffer was incomplete."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}
}